

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

_Bool bc_str_to_bool(char *str)

{
  int iVar1;
  _Bool _Var2;
  
  if (str == (char *)0x0) {
    _Var2 = false;
  }
  else if ((*str == '1') && (str[1] == '\0')) {
    _Var2 = true;
  }
  else {
    iVar1 = strcasecmp(str,"y");
    _Var2 = true;
    if (iVar1 != 0) {
      iVar1 = strcasecmp(str,"yes");
      if (iVar1 != 0) {
        iVar1 = strcasecmp(str,"true");
        if (iVar1 != 0) {
          iVar1 = strcasecmp(str,"on");
          _Var2 = iVar1 == 0;
        }
      }
    }
  }
  return _Var2;
}

Assistant:

bool
bc_str_to_bool(const char *str)
{
    if (str == NULL)
        return false;

    if (0 == strcmp(str, "1"))
        return true;

    if (0 == strcasecmp(str, "y"))
        return true;

    if (0 == strcasecmp(str, "yes"))
        return true;

    if (0 == strcasecmp(str, "true"))
        return true;

    if (0 == strcasecmp(str, "on"))
        return true;

    return false;
}